

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

real_t InvSqrt(real_t x)

{
  undefined1 auVar1 [16];
  float fVar2;
  int i;
  real_t xhalf;
  real_t x_local;
  
  fVar2 = (float)(0x5f375a86 - ((int)x >> 1));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)-(x * 0.5 * fVar2)),
                           SUB6416(ZEXT464(0x3fc00000),0));
  return fVar2 * auVar1._0_4_;
}

Assistant:

static inline real_t InvSqrt(real_t x) {
  real_t xhalf = 0.5f*x;
  int i = *reinterpret_cast<int*>(&x);  // get bits for floating VALUE
  i = 0x5f375a86-(i>>1);  // gives initial guess y0
  x = *reinterpret_cast<real_t*>(&i);  // convert bits BACK to float
  x = x*(1.5f-xhalf*x*x);  // Newton step, repeating increases accuracy
  return x;
}